

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O0

void __thiscall
TPZMatrix<std::complex<long_double>_>::Subtract
          (TPZMatrix<std::complex<long_double>_> *this,TPZMatrix<std::complex<long_double>_> *A,
          TPZMatrix<std::complex<long_double>_> *res)

{
  int iVar1;
  int64_t iVar2;
  int64_t iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  TPZMatrix<std::complex<long_double>_> *pTVar4;
  TPZMatrix<std::complex<long_double>_> *this_01;
  complex<long_double> *in_RDX;
  TPZBaseMatrix *in_RSI;
  TPZBaseMatrix *in_RDI;
  size_t in_stack_000001c8;
  char *in_stack_000001d0;
  int64_t c;
  int64_t r;
  TPZFMatrix<std::complex<long_double>_> *resFmat;
  TPZFMatrix<std::complex<long_double>_> *aFmat;
  TPZFMatrix<std::complex<long_double>_> *thisFmat;
  complex<long_double> *in_stack_fffffffffffffda8;
  complex<long_double> *__x;
  long local_218;
  TPZMatrix<std::complex<long_double>_> *pTVar5;
  undefined1 local_a8 [32];
  undefined1 local_88 [32];
  undefined1 local_68 [16];
  char *in_stack_ffffffffffffffa8;
  char *in_stack_ffffffffffffffb0;
  long local_40;
  long local_38;
  TPZFMatrix<std::complex<long_double>_> *this_00;
  
  iVar2 = TPZBaseMatrix::Rows(in_RDI);
  iVar3 = TPZBaseMatrix::Rows(in_RSI);
  if (iVar2 == iVar3) {
    iVar2 = TPZBaseMatrix::Cols(in_RDI);
    iVar3 = TPZBaseMatrix::Cols(in_RSI);
    if (iVar2 == iVar3) goto LAB_012bc6e9;
  }
  Error(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
LAB_012bc6e9:
  iVar1 = (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x4b])();
  this_00 = (TPZFMatrix<std::complex<long_double>_> *)CONCAT44(extraout_var,iVar1);
  iVar1 = (*(in_RSI->super_TPZSavable)._vptr_TPZSavable[0x4b])();
  if (this_00 != (TPZFMatrix<std::complex<long_double>_> *)CONCAT44(extraout_var_00,iVar1)) {
    std::operator<<((ostream *)&std::cerr,
                    "void TPZMatrix<std::complex<long double>>::Subtract(const TPZMatrix<TVar> &, TPZMatrix<TVar> &) const [T = std::complex<long double>]"
                   );
    std::operator<<((ostream *)&std::cerr,"ERROR\nDifferent number of entries.\nAborting...\n");
    pzinternal::DebugStopImpl(in_stack_000001d0,in_stack_000001c8);
  }
  (**(code **)(*(long *)in_RDX->_M_value + 0xf8))(in_RDX,in_RDI);
  if (in_RDI == (TPZBaseMatrix *)0x0) {
    pTVar4 = (TPZMatrix<std::complex<long_double>_> *)0x0;
  }
  else {
    pTVar4 = (TPZMatrix<std::complex<long_double>_> *)
             __dynamic_cast(in_RDI,&TPZMatrix<std::complex<long_double>>::typeinfo,
                            &TPZFMatrix<std::complex<long_double>>::typeinfo,0);
  }
  pTVar5 = pTVar4;
  if (in_RSI == (TPZBaseMatrix *)0x0) {
    local_218 = 0;
  }
  else {
    local_218 = __dynamic_cast(in_RSI,&TPZMatrix<std::complex<long_double>>::typeinfo,
                               &TPZFMatrix<std::complex<long_double>>::typeinfo,0);
  }
  if (in_RDX == (complex<long_double> *)0x0) {
    this_01 = (TPZMatrix<std::complex<long_double>_> *)0x0;
  }
  else {
    this_01 = (TPZMatrix<std::complex<long_double>_> *)
              __dynamic_cast(in_RDX,&TPZMatrix<std::complex<long_double>>::typeinfo,
                             &TPZFMatrix<std::complex<long_double>>::typeinfo,0);
  }
  if ((this_01 == (TPZMatrix<std::complex<long_double>_> *)0x0) ||
     ((pTVar4 != (TPZMatrix<std::complex<long_double>_> *)0x0 && (local_218 != 0)))) {
    (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x4a])(in_RDI,in_RDX,in_RSI);
    Storage(this_01);
    Storage(this_01);
    TPZFMatrix<std::complex<long_double>_>::operator-=(this_00,pTVar5);
    TPZFMatrixRef<std::complex<long_double>_>::~TPZFMatrixRef
              ((TPZFMatrixRef<std::complex<long_double>_> *)0x12bca31);
    TPZFMatrix<std::complex<long_double>_>::~TPZFMatrix
              ((TPZFMatrix<std::complex<long_double>_> *)0x12bca3e);
  }
  else {
    for (local_38 = 0; iVar2 = TPZBaseMatrix::Rows(in_RDI), local_38 < iVar2;
        local_38 = local_38 + 1) {
      for (local_40 = 0; iVar2 = TPZBaseMatrix::Cols(in_RDI), local_40 < iVar2;
          local_40 = local_40 + 1) {
        __x = in_RDX;
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(local_88,in_RDI,local_38,local_40);
        (*(in_RSI->super_TPZSavable)._vptr_TPZSavable[0x24])(local_a8,in_RSI,local_38,local_40);
        std::operator-(__x,in_stack_fffffffffffffda8);
        (**(code **)(*(long *)__x->_M_value + 0x118))(__x,local_38,local_40,local_68);
      }
    }
  }
  return;
}

Assistant:

void TPZMatrix<TVar>::Subtract(const TPZMatrix<TVar> &A,TPZMatrix<TVar> &res) const {
	
	if ((Rows() != A.Rows()) || (Cols() != A.Cols()) ) {
		Error( "Add(TPZMatrix<>&, TPZMatrix<>&) <different dimensions>" );
	}
	if(this->Size()!=A.Size()){
    PZError<<__PRETTY_FUNCTION__;
    PZError<<"ERROR\nDifferent number of entries.\nAborting...\n";
    DebugStop();
  }
  res.CopyFrom(this);
  auto thisFmat =
    dynamic_cast<const TPZFMatrix<TVar>*>(this);
  auto aFmat =
    dynamic_cast<const TPZFMatrix<TVar>*>(&A);
  auto resFmat =
    dynamic_cast<TPZFMatrix<TVar>*>(&res);
  if(resFmat && (!thisFmat || !aFmat)){
    for ( int64_t r = 0; r < Rows(); r++ )
      for ( int64_t c = 0; c < Cols(); c++ )
        res.PutVal( r, c, GetVal(r,c)-A.GetVal(r,c) );
  }else{
    CheckTypeCompatibility(&res,&A);
    res.Storage() -= A.Storage();
  }
}